

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void DockNodeFindInfo(ImGuiDockNode *node,ImGuiDockNodeTreeInfo *info)

{
  bool bVar1;
  ImGuiDockNodeTreeInfo *info_local;
  ImGuiDockNode *node_local;
  
  if (0 < (node->Windows).Size) {
    if (info->FirstNodeWithWindows == (ImGuiDockNode *)0x0) {
      info->FirstNodeWithWindows = node;
    }
    info->CountNodesWithWindows = info->CountNodesWithWindows + 1;
  }
  bVar1 = ImGuiDockNode::IsCentralNode(node);
  if (bVar1) {
    if (info->CentralNode != (ImGuiDockNode *)0x0) {
      __assert_fail("info->CentralNode == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x35a7,"void DockNodeFindInfo(ImGuiDockNode *, ImGuiDockNodeTreeInfo *)");
    }
    bVar1 = ImGuiDockNode::IsLeafNode(node);
    if (!bVar1) {
      __assert_fail("node->IsLeafNode() && \"If you get this assert: please submit .ini file + repro of actions leading to this.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x35a8,"void DockNodeFindInfo(ImGuiDockNode *, ImGuiDockNodeTreeInfo *)");
    }
    info->CentralNode = node;
  }
  if ((info->CountNodesWithWindows < 2) || (info->CentralNode == (ImGuiDockNode *)0x0)) {
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeFindInfo(node->ChildNodes[0],info);
    }
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeFindInfo(node->ChildNodes[1],info);
    }
  }
  return;
}

Assistant:

static void DockNodeFindInfo(ImGuiDockNode* node, ImGuiDockNodeTreeInfo* info)
{
    if (node->Windows.Size > 0)
    {
        if (info->FirstNodeWithWindows == NULL)
            info->FirstNodeWithWindows = node;
        info->CountNodesWithWindows++;
    }
    if (node->IsCentralNode())
    {
        IM_ASSERT(info->CentralNode == NULL); // Should be only one
        IM_ASSERT(node->IsLeafNode() && "If you get this assert: please submit .ini file + repro of actions leading to this.");
        info->CentralNode = node;
    }
    if (info->CountNodesWithWindows > 1 && info->CentralNode != NULL)
        return;
    if (node->ChildNodes[0])
        DockNodeFindInfo(node->ChildNodes[0], info);
    if (node->ChildNodes[1])
        DockNodeFindInfo(node->ChildNodes[1], info);
}